

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

void __thiscall
llm_build_phi3::llm_build_phi3
          (llm_build_phi3 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *this_00;
  llama_memory_i *plVar2;
  pointer plVar3;
  ggml_context *pgVar4;
  uint32_t uVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  undefined8 uVar10;
  int il;
  long lVar11;
  long lVar12;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar13;
  ggml_tensor *local_78;
  int local_60;
  undefined4 local_5c;
  ggml_cgraph *local_58;
  ulong local_50;
  ggml_tensor *local_48;
  undefined8 local_40;
  llm_graph_input_attn_kv_unified *local_38;
  
  local_58 = gf;
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  this_00 = (this->super_llm_graph_context).hparams;
  uVar1 = this_00->n_embd_head_v;
  uVar5 = llama_hparams::n_embd_v_gqa(this_00,0);
  if (uVar1 != ((this->super_llm_graph_context).hparams)->n_embd_head_k) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1bd6,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_78 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  local_48 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  local_38 = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  if (0 < (this->super_llm_graph_context).n_layer) {
    local_50 = (ulong)uVar5;
    lVar12 = 0;
    lVar11 = 0;
    do {
      uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      plVar2 = (this->super_llm_graph_context).memory;
      local_5c = (undefined4)(this->super_llm_graph_context).n_ctx_per_seq;
      il = (int)lVar11;
      local_60 = il;
      if (plVar2[10]._vptr_llama_memory_i == (_func_int **)0x0) {
        std::__throw_bad_function_call();
      }
      local_40 = (*(code *)plVar2[0xb]._vptr_llama_memory_i)(plVar2 + 8,&local_5c,&local_60);
      plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar6 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_78,
                          *(ggml_tensor **)((long)&plVar3->attn_norm + lVar12),
                          *(ggml_tensor **)((long)&plVar3->attn_norm_b + lVar12),LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"attn_norm",il);
      plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar8 = *(ggml_tensor **)((long)&plVar3->wqkv + lVar12);
      if (pgVar8 == (ggml_tensor *)0x0) {
        pgVar4 = (this->super_llm_graph_context).ctx0;
        pgVar8 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)((long)&plVar3->wq + lVar12),pgVar6);
        pgVar8 = (ggml_tensor *)
                 ggml_add(pgVar4,pgVar8,
                          *(undefined8 *)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->bq + lVar12));
        pgVar4 = (this->super_llm_graph_context).ctx0;
        pgVar9 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wk + lVar12),pgVar6
                           );
        pgVar9 = (ggml_tensor *)
                 ggml_add(pgVar4,pgVar9,
                          *(undefined8 *)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->bk + lVar12));
        pgVar4 = (this->super_llm_graph_context).ctx0;
        pgVar6 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wv + lVar12),pgVar6
                           );
        pgVar6 = (ggml_tensor *)
                 ggml_add(pgVar4,pgVar6,
                          *(undefined8 *)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->bv + lVar12));
      }
      else {
        pgVar6 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,pgVar8,pgVar6);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"wqkv",il);
        pgVar4 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar4,pgVar6,(this->super_llm_graph_context).n_embd,
                             (long)(this->super_llm_graph_context).n_tokens,pgVar6->nb[1],0);
        pgVar8 = (ggml_tensor *)ggml_cont(pgVar4,uVar7);
        pgVar4 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar4,pgVar6,local_50,(long)(this->super_llm_graph_context).n_tokens,
                             pgVar6->nb[1],(this->super_llm_graph_context).n_embd << 2);
        pgVar9 = (ggml_tensor *)ggml_cont(pgVar4,uVar7);
        pgVar4 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar4,pgVar6,local_50,(long)(this->super_llm_graph_context).n_tokens,
                             pgVar6->nb[1],((this->super_llm_graph_context).n_embd + local_50) * 4);
        pgVar6 = (ggml_tensor *)ggml_cont(pgVar4,uVar7);
      }
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Qcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
      uVar7 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar1,
                              (this->super_llm_graph_context).n_head,
                              (long)(this->super_llm_graph_context).n_tokens);
      uVar10 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar9,uVar1,
                               (this->super_llm_graph_context).n_head_kv,
                               (long)(this->super_llm_graph_context).n_tokens);
      pgVar8 = (ggml_tensor *)
               ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                               (this->super_llm_graph_context).n_head_kv,
                               (long)(this->super_llm_graph_context).n_tokens);
      pgVar6 = (ggml_tensor *)
               ggml_rope_ext((this->super_llm_graph_context).freq_base,
                             (this->super_llm_graph_context).freq_scale,
                             (this->super_llm_graph_context).ext_factor,
                             (this->super_llm_graph_context).attn_factor,
                             (this->super_llm_graph_context).beta_fast,
                             (this->super_llm_graph_context).beta_slow,
                             (this->super_llm_graph_context).ctx0,uVar7,local_48,local_40,
                             (int)(this->super_llm_graph_context).n_rot,
                             (this->super_llm_graph_context).rope_type,
                             CONCAT44(uVar13,(this->super_llm_graph_context).n_ctx_orig));
      pgVar9 = (ggml_tensor *)
               ggml_rope_ext((this->super_llm_graph_context).freq_base,
                             (this->super_llm_graph_context).freq_scale,
                             (this->super_llm_graph_context).ext_factor,
                             (this->super_llm_graph_context).attn_factor,
                             (this->super_llm_graph_context).beta_fast,
                             (this->super_llm_graph_context).beta_slow,
                             (this->super_llm_graph_context).ctx0,uVar10,local_48,local_40,
                             (int)(this->super_llm_graph_context).n_rot,
                             (this->super_llm_graph_context).rope_type,
                             (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Qcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Vcur",il);
      pgVar6 = (ggml_tensor *)
               ggml_scale(1.0 / SQRT((float)uVar1),(this->super_llm_graph_context).ctx0,pgVar6);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Qcur",il);
      plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar8 = llm_graph_context::build_attn
                         (&this->super_llm_graph_context,local_38,local_58,
                          *(ggml_tensor **)((long)&plVar3->wo + lVar12),
                          *(ggml_tensor **)((long)&plVar3->bo + lVar12),pgVar6,pgVar9,pgVar8,
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0,il);
      if (lVar11 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar6 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar8 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar8,pgVar6);
        local_78 = (ggml_tensor *)
                   ggml_get_rows((this->super_llm_graph_context).ctx0,local_78,pgVar6);
      }
      pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,local_78);
      plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar9 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,pgVar6,
                          *(ggml_tensor **)((long)&plVar3->ffn_norm + lVar12),
                          *(ggml_tensor **)((long)&plVar3->ffn_norm_b + lVar12),LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"ffn_norm",il);
      plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar8 = *(ggml_tensor **)((long)&plVar3->ffn_gate_inp + lVar12);
      if (pgVar8 == (ggml_tensor *)0x0) {
        in_stack_ffffffffffffff28 = 0;
        pgVar8 = llm_graph_context::build_ffn
                           (&this->super_llm_graph_context,pgVar9,
                            *(ggml_tensor **)((long)&plVar3->ffn_up + lVar12),(ggml_tensor *)0x0,
                            (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                            (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar3->ffn_down + lVar12),
                            (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SWIGLU,
                            LLM_FFN_SEQ,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_out",il);
      }
      else {
        in_stack_ffffffffffffff28 = 0;
        pgVar8 = llm_graph_context::build_moe_ffn
                           (&this->super_llm_graph_context,pgVar9,pgVar8,
                            *(ggml_tensor **)((long)&plVar3->ffn_up_exps + lVar12),
                            *(ggml_tensor **)((long)&plVar3->ffn_gate_exps + lVar12),
                            *(ggml_tensor **)((long)&plVar3->ffn_down_exps + lVar12),
                            (ggml_tensor *)0x0,(this->super_llm_graph_context).n_expert,
                            (this->super_llm_graph_context).n_expert_used,LLM_FFN_SILU,true,false,
                            0.0,LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_moe_out",il);
      }
      pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,pgVar8);
      local_78 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar8,il);
      llm_graph_context::cb(&this->super_llm_graph_context,local_78,"l_out",il);
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x4f0;
    } while (lVar11 < (this->super_llm_graph_context).n_layer);
  }
  pgVar8 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_78,model->output_norm,
                      model->output_norm_b,LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar8;
  pgVar8 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar8);
  if (model->output_b != (ggml_tensor *)0x0) {
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"result_output_no_bias",-1);
    pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,model->output_b);
  }
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar8;
  ggml_build_forward_expand(local_58,pgVar8);
  return;
}

Assistant:

llm_build_phi3(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            auto * residual = inpL;

            // self-attention
            {
                // rope freq factors for 128k context
                ggml_tensor * rope_factors = static_cast<const llama_kv_cache_unified *>(memory)->cbs.get_rope_factors(n_ctx_per_seq, il);

                ggml_tensor* attn_norm_output = build_norm(inpL,
                        model.layers[il].attn_norm,
                        model.layers[il].attn_norm_b,
                        LLM_NORM_RMS, il);
                cb(attn_norm_output, "attn_norm", il);

                ggml_tensor * Qcur = nullptr;
                ggml_tensor * Kcur = nullptr;
                ggml_tensor * Vcur = nullptr;

                if (model.layers[il].wqkv) {
                    cur = build_lora_mm(model.layers[il].wqkv, attn_norm_output);
                    cb(cur, "wqkv", il);

                    Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0 * sizeof(float) * (n_embd)));
                    Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1 * sizeof(float) * (n_embd)));
                    Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1 * sizeof(float) * (n_embd + n_embd_gqa)));
                } else {
                    Qcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wq, attn_norm_output), model.layers[il].bq);
                    Kcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wk, attn_norm_output), model.layers[il].bk);
                    Vcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wv, attn_norm_output), model.layers[il].bv);
                }

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_scale(ctx0, Qcur, 1.0f / sqrtf(float(n_embd_head)));
                cb(Qcur, "Qcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor* inp_out_ids = build_inp_out_ids();
                cur      = ggml_get_rows(ctx0, cur,      inp_out_ids);
                residual = ggml_get_rows(ctx0, residual, inp_out_ids);
            }

            cur = ggml_add(ctx0, cur, residual);
            residual = cur;

            cur = build_norm(cur,
                    model.layers[il].ffn_norm, model.layers[il].ffn_norm_b,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            // feed-forward network
            if (model.layers[il].ffn_gate_inp == nullptr) {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        NULL,                      NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SWIGLU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);
            } else {
                // MoE branch
                cur = build_moe_ffn(cur,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, true,
                        false, 0.0,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                        il);
                cb(cur, "ffn_moe_out", il);
            }

            cur = ggml_add(ctx0, residual, cur);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        if (model.output_b != nullptr) {
            cb(cur, "result_output_no_bias", -1);
            cur = ggml_add(ctx0, cur, model.output_b);
        }

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }